

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ctrl_t *pcVar1;
  bool bVar2;
  uintptr_t v;
  slot_type *psVar3;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  size_t sVar7;
  Descriptor *pDVar8;
  MessagePrinter *pMVar9;
  byte bVar10;
  ctrl_t cVar11;
  ulong uVar12;
  ulong uVar13;
  FindInfo FVar14;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  size_t local_38;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                 );
  }
  sVar4 = common->capacity_;
  if (sVar4 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                 );
  }
  bVar6 = 0x80;
  if ((sVar4 == 1) &&
     (AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                  *)common), 1 < common->size_)) {
    psVar3 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                       *)common);
    uVar5 = ((ulong)(psVar3->value).first ^ 0x572bb8) * -0x234dd359734ecb13;
    bVar6 = (byte)(((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                     (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                     (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                     (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ (ulong)(psVar3->value).first) *
                   0x5cb22ca68cb134ed >> 0x38) & 0x7f;
    bVar10 = 1;
  }
  else {
    bVar10 = 0;
  }
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar4 == 1;
  local_3e = bVar10;
  local_38 = sVar4;
  if (bVar10 == 0) {
    pDVar8 = (Descriptor *)(common->heap_or_soo_).heap.control;
    local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  }
  else {
    psVar3 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                       *)common);
    sVar4 = common->capacity_;
    common->capacity_ = 0xffffffffffffff9c;
    pDVar8 = (psVar3->value).first;
    local_58.heap.slot_array =
         (MaybeInitializedPtr)
         (psVar3->value).second._M_t.
         super___uniq_ptr_impl<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
         .super__Head_base<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_false>.
         _M_head_impl;
    (psVar3->value).second._M_t.
    super___uniq_ptr_impl<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
    .super__Head_base<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_false>._M_head_impl
         = (MessagePrinter *)0x0;
    CommonFields::set_capacity(common,sVar4);
  }
  local_58.heap.control = (ctrl_t *)pDVar8;
  CommonFields::set_capacity(common,new_capacity);
  bVar2 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,false,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar6,8,0x10);
  sVar4 = local_38;
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                 );
  }
  if ((bVar10 | local_38 != 1) != 1) {
    return;
  }
  psVar3 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                       *)common);
  if (bVar2) {
    if (sVar4 != 1) {
      HashSetResizeHelper::
      GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,void>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                ((HashSetResizeHelper *)&local_58.heap,common,
                 (allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>
                  *)common);
LAB_00306686:
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      return;
    }
    sVar4 = common->capacity_;
    common->capacity_ = 0xffffffffffffff9c;
    psVar3[1].value.first = (Descriptor *)local_58.heap.control;
    ((MaybeInitializedPtr *)((long)psVar3 + 0x18))->p = (void *)local_58.heap.slot_array;
  }
  else {
    if (sVar4 != 1) {
      if (local_3f == '\x01') {
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      if (local_48 != 0) {
        pMVar9 = (MessagePrinter *)((long)local_58.heap.slot_array + 8);
        sVar7 = 0;
        sVar4 = local_48;
        do {
          if (local_3f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_58.heap.control[sVar7]) {
            uVar5 = (*(ulong *)(pMVar9 + -8) ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                    -0x234dd359734ecb13;
            uVar13 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                       (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                       (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                       (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ *(ulong *)(pMVar9 + -8)) *
                     -0x234dd359734ecb13;
            FVar14 = find_first_non_full<void>
                               (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                       (uVar13 & 0xff0000000000) >> 0x18 |
                                       (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
                                       (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
                                       uVar13 << 0x38);
            uVar12 = FVar14.offset;
            uVar5 = common->capacity_;
            if (uVar5 <= uVar12) goto LAB_003066c8;
            cVar11 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
            pcVar1 = (common->heap_or_soo_).heap.control;
            pcVar1[uVar12] = cVar11;
            pcVar1[(ulong)((uint)uVar5 & 0xf) + (uVar12 - 0xf & uVar5)] = cVar11;
            common->capacity_ = 0xffffffffffffff9c;
            psVar3[uVar12].value.first = *(Descriptor **)(pMVar9 + -8);
            *(undefined8 *)((long)psVar3 + uVar12 * 0x10 + 8) = *(undefined8 *)pMVar9;
            *(undefined8 *)pMVar9 = 0;
            CommonFields::set_capacity(common,uVar5);
            sVar4 = local_48;
          }
          sVar7 = sVar7 + 1;
          pMVar9 = pMVar9 + 0x10;
        } while (sVar7 != sVar4);
      }
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      goto LAB_00306686;
    }
    uVar5 = ((ulong)local_58.heap.control ^ 0x572bb8) * -0x234dd359734ecb13;
    uVar12 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^
             (ulong)local_58.heap.control) * -0x234dd359734ecb13;
    FVar14 = find_first_non_full<void>
                       (common,uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                               (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
    uVar5 = FVar14.offset;
    sVar4 = common->capacity_;
    if (sVar4 <= uVar5) {
LAB_003066c8:
      __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x744,
                    "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                   );
    }
    cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
    pcVar1 = (common->heap_or_soo_).heap.control;
    pcVar1[uVar5] = cVar11;
    pcVar1[(ulong)((uint)sVar4 & 0xf) + (uVar5 - 0xf & sVar4)] = cVar11;
    common->capacity_ = 0xffffffffffffff9c;
    psVar3[uVar5].value.first = (Descriptor *)local_58.heap.control;
    ((MaybeInitializedPtr *)((long)psVar3 + uVar5 * 0x10 + 8))->p = (void *)local_58.heap.slot_array
    ;
  }
  local_58.heap.slot_array = (MaybeInitializedPtr)0x0;
  CommonFields::set_capacity(common,sVar4);
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }